

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_get_ulong(AMQP_VALUE value,uint64_t *ulong_value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || ulong_value == (uint64_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x1cd;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_ulong",0x1cc,1,"Bad arguments: value = %p, ulong_value = %p",value,
                ulong_value);
    }
  }
  else if (value->type == AMQP_TYPE_ULONG) {
    *ulong_value = (uint64_t)(value->value).described_value.descriptor;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x1d6;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_ulong",0x1d5,1,"Value is not of type ULONG");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_ulong(AMQP_VALUE value, uint64_t* ulong_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_053: [If any of the arguments is NULL then amqpvalue_get_ulong shall return a non-zero value.] */
    if ((value == NULL) ||
        (ulong_value == NULL))
    {
        LogError("Bad arguments: value = %p, ulong_value = %p",
            value, ulong_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_054: [If the type of the value is not ulong (was not created with amqpvalue_create_ulong), then amqpvalue_get_ulong shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_ULONG)
        {
            LogError("Value is not of type ULONG");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_051: [amqpvalue_get_ulong shall fill in the ulong_value argument the ulong64_t value stored by the AMQP value indicated by the value argument.] */
            *ulong_value = value_data->value.ulong_value;

            /* Codes_SRS_AMQPVALUE_01_052: [On success amqpvalue_get_ulong shall return 0.] */
            result = 0;
        }
    }

    return result;
}